

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O2

bool __thiscall Minisat::parseOptions(Minisat *this,int *argc,char **argv,bool strict)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  vec<Minisat::Option_*> *pvVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  char **ppcVar9;
  int k;
  long lVar10;
  long lVar11;
  char local_3c;
  char *str;
  
  iVar8 = 1;
  lVar11 = 1;
  bVar7 = false;
  while( true ) {
    if (*(int *)this <= lVar11) {
      *(int *)this = (iVar8 - (int)lVar11) + *(int *)this;
      return bVar7;
    }
    str = *(char **)(argc + lVar11 * 2);
    bVar3 = match<char_const*>(&str,"--");
    if (((bVar3) &&
        (bVar3 = match<char_const*>(&str,Option::getHelpPrefixString()::help_prefix_str), bVar3)) &&
       (ppcVar9 = &str, bVar3 = match<char_const*>(&str,"help"), bVar3)) break;
    lVar10 = 0;
    uVar4 = 0;
    while ((uVar4 & 1) == 0) {
      pvVar5 = Option::getOptionList();
      if (pvVar5->sz <= lVar10) {
        pcVar6 = *(char **)(argc + lVar11 * 2);
        local_3c = (char)argv;
        if ((local_3c != '\0') && (*pcVar6 == '-')) {
          *(char **)(argc + lVar11 * 2) = pcVar6 + 1;
          fprintf(_stderr,"ERROR! Unknown flag \"%s\". Use \'--%shelp\' for help.\n",pcVar6 + 1,
                  Option::getHelpPrefixString()::help_prefix_str);
          exit(1);
        }
        lVar10 = (long)iVar8;
        iVar8 = iVar8 + 1;
        *(char **)(argc + lVar10 * 2) = pcVar6;
        break;
      }
      pvVar5 = Option::getOptionList();
      uVar4 = (*pvVar5->data[lVar10]->_vptr_Option[2])
                        (pvVar5->data[lVar10],*(undefined8 *)(argc + lVar11 * 2));
      lVar10 = lVar10 + 1;
    }
LAB_00129434:
    lVar11 = lVar11 + 1;
  }
  if (*str == '\0') {
    printUsageAndExit((int)ppcVar9,(char **)argc,false);
  }
  else {
    ppcVar9 = &str;
    bVar3 = match<char_const*>(&str,"-verb");
    bVar7 = true;
    if (!bVar3) goto LAB_00129434;
  }
  printUsageAndExit((int)ppcVar9,(char **)argc,true);
  pcVar6 = *ppcVar9;
  do {
    cVar1 = (char)*argc;
    if (cVar1 == '\0') {
      *ppcVar9 = pcVar6;
      break;
    }
    argc = (int *)((long)argc + 1);
    cVar2 = *pcVar6;
    pcVar6 = pcVar6 + 1;
  } while (cVar2 == cVar1);
  return cVar1 == '\0';
}

Assistant:

bool MERGESAT_NSPACE::parseOptions(int &argc, char **argv, bool strict)
{
    int i, j;
    bool ret = false;
    for (i = j = 1; i < argc; i++) {
        const char *str = argv[i];
        if (match(str, "--") && match(str, Option::getHelpPrefixString()) && match(str, "help")) {
            if (*str == '\0')
                printUsageAndExit(argc, argv);
            else if (match(str, "-verb"))
                printUsageAndExit(argc, argv, true);
            ret = true;
        } else {
            bool parsed_ok = false;

            for (int k = 0; !parsed_ok && k < Option::getOptionList().size(); k++) {
                parsed_ok = Option::getOptionList()[k]->parse(argv[i]);

                // fprintf(stderr, "checking %d: %s against flag <%s> (%s)\n", i, argv[i], Option::getOptionList()[k]->name, parsed_ok ? "ok" : "skip");
            }

            if (!parsed_ok) {
                if (strict && match(argv[i], "-")) {
                    fprintf(stderr, "ERROR! Unknown flag \"%s\". Use '--%shelp' for help.\n", argv[i],
                            Option::getHelpPrefixString()),
                    exit(1);
                } else {
                    argv[j++] = argv[i];
                }
            }
        }
    }

    argc -= (i - j);

    return ret; /* indicate whether --help was specified */
}